

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_pspr.cpp
# Opt level: O2

void DPSprite::NewTick(void)

{
  TObjPtr<DPSprite> *obj;
  DPSprite *pDVar1;
  int i;
  long lVar2;
  
  for (lVar2 = 0; lVar2 != 8; lVar2 = lVar2 + 1) {
    if (playeringame[lVar2] == true) {
      obj = (TObjPtr<DPSprite> *)(&DAT_009ba500 + lVar2 * 0x2a0);
      while( true ) {
        pDVar1 = GC::ReadBarrier<DPSprite>((DPSprite **)obj);
        if (pDVar1 == (DPSprite *)0x0) break;
        pDVar1->processPending = true;
        pDVar1->oldx = pDVar1->x;
        pDVar1->oldy = pDVar1->y;
        obj = &pDVar1->Next;
      }
    }
  }
  return;
}

Assistant:

void DPSprite::NewTick()
{
	// This function should be called after the beginning of a tick, before any possible
	// prprite-event, or near the end, after any possible psprite event.
	// Because data is reset for every tick (which it must be) this has no impact on savegames.
	for (int i = 0; i < MAXPLAYERS; i++)
	{
		if (playeringame[i])
		{
			DPSprite *pspr = players[i].psprites;
			while (pspr)
			{
				pspr->processPending = true;
				pspr->oldx = pspr->x;
				pspr->oldy = pspr->y;

				pspr = pspr->Next;
			}
		}
	}
}